

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<4,_10,_10>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int i;
  undefined8 *puVar1;
  Vector<float,_4> *pVVar2;
  float *pfVar3;
  long lVar4;
  undefined4 *puVar5;
  Vector<float,_4> *b;
  long lVar6;
  Vector<float,_4> *pVVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar12;
  undefined4 uVar13;
  Vector<float,_3> res_1;
  Vector<float,_3> res;
  Type in1;
  Type in0;
  float afStack_108 [6];
  float local_f0 [2];
  undefined8 local_e8;
  undefined4 local_e0;
  float local_d8 [4];
  float local_c8 [4];
  float local_b8 [4];
  Matrix<float,_4,_3> local_a8;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  Matrix<float,_4,_3> local_40;
  long lVar11;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    puVar1 = &local_68;
    lVar4 = 0;
    lVar6 = 0;
    do {
      lVar8 = 0;
      auVar9 = _DAT_00ada920;
      do {
        bVar12 = SUB164(auVar9 ^ _DAT_00ad8f80,4) == -0x80000000 &&
                 SUB164(auVar9 ^ _DAT_00ad8f80,0) < -0x7ffffffd;
        if (bVar12) {
          uVar13 = 0x3f800000;
          if (lVar4 != lVar8) {
            uVar13 = 0;
          }
          *(undefined4 *)((long)puVar1 + lVar8 + -0x10) = uVar13;
        }
        if (bVar12) {
          uVar13 = 0x3f800000;
          if (lVar4 + -0x10 != lVar8) {
            uVar13 = 0;
          }
          *(undefined4 *)((long)puVar1 + lVar8) = uVar13;
        }
        lVar11 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 2;
        auVar9._8_8_ = lVar11 + 2;
        lVar8 = lVar8 + 0x20;
      } while (lVar8 != 0x40);
      lVar6 = lVar6 + 1;
      lVar4 = lVar4 + 0x10;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
    } while (lVar6 != 4);
    local_78 = *(undefined8 *)evalCtx->in[0].m_data;
    uStack_70 = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_68 = *(undefined8 *)evalCtx->in[1].m_data;
    uStack_60 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_58 = *(undefined8 *)evalCtx->in[2].m_data;
    uStack_50 = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  }
  else {
    puVar1 = &local_78;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    puVar5 = &s_constInMat3x4;
    lVar4 = 0;
    do {
      lVar6 = 0;
      do {
        *(undefined4 *)((long)puVar1 + lVar6 * 4) = *(undefined4 *)((long)puVar5 + lVar6);
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0xc);
      lVar4 = lVar4 + 1;
      puVar1 = (undefined8 *)((long)puVar1 + 4);
      puVar5 = puVar5 + 3;
    } while (lVar4 != 4);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    pVVar2 = local_a8.m_data.m_data + 1;
    b = (Vector<float,_4> *)0x0;
    lVar4 = 0;
    do {
      pVVar7 = (Vector<float,_4> *)0x0;
      auVar10 = _DAT_00ada920;
      do {
        bVar12 = SUB164(auVar10 ^ _DAT_00ad8f80,4) == -0x80000000 &&
                 SUB164(auVar10 ^ _DAT_00ad8f80,0) < -0x7ffffffd;
        if (bVar12) {
          uVar13 = 0x3f800000;
          if (b != pVVar7) {
            uVar13 = 0;
          }
          *(undefined4 *)((long)pVVar7[-1].m_data + (long)pVVar2) = uVar13;
        }
        if (bVar12) {
          uVar13 = 0x3f800000;
          if ((((Matrix<float,_4,_3> *)((long)b + -0x30))->m_data).m_data + 2 != pVVar7) {
            uVar13 = 0;
          }
          *(undefined4 *)((long)pVVar7->m_data + (long)pVVar2->m_data) = uVar13;
        }
        lVar6 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 2;
        auVar10._8_8_ = lVar6 + 2;
        pVVar7 = pVVar7 + 2;
      } while (pVVar7 != (Vector<float,_4> *)0x40);
      lVar4 = lVar4 + 1;
      b = (((Matrix<float,_4,_3> *)b)->m_data).m_data + 1;
      pVVar2 = (Vector<float,_4> *)(pVVar2->m_data + 1);
    } while (lVar4 != 4);
    local_a8.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_a8.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_a8.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_a8.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_a8.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_a8.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  }
  else {
    pfVar3 = (float *)&local_a8;
    local_a8.m_data.m_data[2].m_data[0] = 0.0;
    local_a8.m_data.m_data[2].m_data[1] = 0.0;
    local_a8.m_data.m_data[2].m_data[2] = 0.0;
    local_a8.m_data.m_data[2].m_data[3] = 0.0;
    local_a8.m_data.m_data[1].m_data[0] = 0.0;
    local_a8.m_data.m_data[1].m_data[1] = 0.0;
    local_a8.m_data.m_data[1].m_data[2] = 0.0;
    local_a8.m_data.m_data[1].m_data[3] = 0.0;
    local_a8.m_data.m_data[0].m_data[0] = 0.0;
    local_a8.m_data.m_data[0].m_data[1] = 0.0;
    local_a8.m_data.m_data[0].m_data[2] = 0.0;
    local_a8.m_data.m_data[0].m_data[3] = 0.0;
    b = (Vector<float,_4> *)&DAT_00ae3d90;
    lVar4 = 0;
    do {
      lVar6 = 0;
      do {
        pfVar3[lVar6] = (float)*(undefined4 *)((long)b->m_data + lVar6);
        lVar6 = lVar6 + 4;
      } while (lVar6 != 0xc);
      lVar4 = lVar4 + 1;
      pfVar3 = pfVar3 + 1;
      b = (Vector<float,_4> *)(b->m_data + 3);
    } while (lVar4 != 4);
  }
  matrixCompMult<float,4,3>
            (&local_40,(MatrixCaseUtils *)&local_78,&local_a8,(Matrix<float,_4,_3> *)b);
  local_b8[0] = local_40.m_data.m_data[0].m_data[0];
  local_b8[1] = local_40.m_data.m_data[0].m_data[1];
  local_b8[2] = local_40.m_data.m_data[0].m_data[2];
  local_c8[0] = local_40.m_data.m_data[1].m_data[1];
  local_c8[1] = local_40.m_data.m_data[1].m_data[2];
  local_c8[2] = local_40.m_data.m_data[1].m_data[3];
  local_f0[0] = 0.0;
  local_f0[1] = 0.0;
  local_e8 = (ulong)local_e8._4_4_ << 0x20;
  lVar4 = 0;
  do {
    local_f0[lVar4] = local_b8[lVar4] + local_c8[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_d8[0] = local_40.m_data.m_data[2].m_data[2];
  local_d8[1] = local_40.m_data.m_data[2].m_data[3];
  local_d8[2] = local_40.m_data.m_data[2].m_data[0];
  afStack_108[2] = 0.0;
  afStack_108[3] = 0.0;
  afStack_108[4] = 0.0;
  lVar4 = 0;
  do {
    afStack_108[lVar4 + 2] = local_f0[lVar4] + local_d8[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_e8 = 0x100000000;
  local_e0 = 2;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[(int)local_f0[lVar4]] = afStack_108[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}